

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O2

void __thiscall OpenMD::LJ::addType(LJ *this,AtomType *atomType)

{
  int iVar1;
  long lVar2;
  AtomType *atomType2;
  _Base_ptr p_Var3;
  long lVar4;
  long lVar5;
  LJ *this_00;
  long lVar6;
  RealType RVar7;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar8;
  int atid;
  uint local_94;
  size_t local_90;
  RealType local_88;
  long local_70;
  _Rb_tree_node_base *local_68;
  double local_60;
  RealType local_58;
  string local_50;
  
  local_94 = AtomType::getIdent(atomType);
  local_90 = (this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pVar8 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->LJtypes,(int *)&local_94);
  if (pVar8.second == false) {
    snprintf(painCave.errMsg,2000,"LJ already had a previous entry with ident %d\n",(ulong)local_94)
    ;
    painCave.isFatal = 0;
    painCave.severity = 3;
    simError();
  }
  RVar7 = getSigma(this,atomType,atomType);
  if (ABS(RVar7) < 2.220446049250313e-16) {
    local_88 = RVar7;
    AtomType::getName_abi_cxx11_(&local_50,atomType);
    snprintf(painCave.errMsg,2000,
             "Lennard-Jones atom %s was defined with a sigma value (%f)\n\tthat was too close to zero."
             ,local_88,local_50._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_50);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start[(int)local_94] = (int)local_90;
  lVar5 = (long)(int)local_90;
  local_70 = lVar5 * 0x18;
  std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar5,(long)this->nLJ_);
  local_68 = &(this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_header;
  lVar5 = lVar5 * 0x20;
  for (p_Var3 = (this->LJtypes)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var3 != local_68; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    iVar1 = (this->LJtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[(int)p_Var3[1]._M_color];
    lVar6 = (long)iVar1;
    atomType2 = ForceField::getAtomType(this->forceField_,p_Var3[1]._M_color);
    this_00 = this;
    local_88 = getSigma(this,atomType,atomType2);
    local_58 = getEpsilon(this_00,atomType,atomType2);
    local_60 = 1.0 / local_88;
    std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>::resize
              ((this->MixingMap).
               super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar6,(long)this->nLJ_);
    lVar2 = *(long *)((long)&(((this->MixingMap).
                               super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                             super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                             )._M_impl.super__Vector_impl_data + local_70);
    lVar4 = lVar6 * 0x20;
    *(RealType *)(lVar2 + lVar4) = local_88;
    *(RealType *)(lVar2 + 8 + lVar4) = local_58;
    *(double *)(lVar2 + 0x10 + lVar4) = local_60;
    *(undefined1 *)(lVar2 + 0x18 + lVar4) = 0;
    if (iVar1 != (int)local_90) {
      lVar2 = *(long *)&(this->MixingMap).
                        super__Vector_base<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>,_std::allocator<std::vector<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar6].
                        super__Vector_base<OpenMD::LJInteractionData,_std::allocator<OpenMD::LJInteractionData>_>
                        ._M_impl.super__Vector_impl_data;
      *(RealType *)(lVar2 + lVar5) = local_88;
      *(RealType *)(lVar2 + 8 + lVar5) = local_58;
      *(double *)(lVar2 + 0x10 + lVar5) = local_60;
      *(undefined1 *)(lVar2 + 0x18 + lVar5) = 0;
    }
  }
  return;
}

Assistant:

void LJ::addType(AtomType* atomType) {
    // add it to the map:
    int atid  = atomType->getIdent();
    int ljtid = LJtypes.size();

    pair<set<int>::iterator, bool> ret;
    ret = LJtypes.insert(atid);
    if (ret.second == false) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "LJ already had a previous entry with ident %d\n", atid);
      painCave.severity = OPENMD_INFO;
      painCave.isFatal  = 0;
      simError();
    }

    // Check to make sure the 1/sigma won't cause problems later:
    RealType s = getSigma(atomType, atomType);
    if (fabs(s) < std::numeric_limits<RealType>::epsilon()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Lennard-Jones atom %s was defined with a sigma value (%f)\n"
               "\tthat was too close to zero.",
               atomType->getName().c_str(), s);
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    LJtids[atid] = ljtid;
    MixingMap[ljtid].resize(nLJ_);

    // Now, iterate over all known types and add to the mixing map:

    std::set<int>::iterator it;
    for (it = LJtypes.begin(); it != LJtypes.end(); ++it) {
      int ljtid2       = LJtids[(*it)];
      AtomType* atype2 = forceField_->getAtomType((*it));

      LJInteractionData mixer;
      mixer.sigma         = getSigma(atomType, atype2);
      mixer.epsilon       = getEpsilon(atomType, atype2);
      mixer.sigmai        = 1.0 / mixer.sigma;
      mixer.explicitlySet = false;
      MixingMap[ljtid2].resize(nLJ_);

      MixingMap[ljtid][ljtid2] = mixer;
      if (ljtid2 != ljtid) { MixingMap[ljtid2][ljtid] = mixer; }
    }
  }